

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O3

FT_Error tt_face_colr_blend_layer
                   (TT_Face face,FT_UInt color_index,FT_GlyphSlot dstSlot,FT_GlyphSlot srcSlot)

{
  FT_UInt *pFVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  FT_Color *pFVar7;
  FT_UShort *pFVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  FT_Int FVar13;
  uchar *puVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  uchar *puVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  byte bVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  FT_Byte *__dest;
  int iVar29;
  ulong uVar30;
  FT_Error error;
  int local_5c;
  FT_Byte *local_58;
  uint local_4c;
  TT_Face local_48;
  FT_GlyphSlot local_40;
  
  if ((dstSlot->bitmap).buffer == (uchar *)0x0) {
    FVar13 = srcSlot->bitmap_top;
    dstSlot->bitmap_left = srcSlot->bitmap_left;
    dstSlot->bitmap_top = FVar13;
    uVar21 = (srcSlot->bitmap).width;
    (dstSlot->bitmap).width = uVar21;
    uVar16 = (srcSlot->bitmap).rows;
    (dstSlot->bitmap).rows = uVar16;
    (dstSlot->bitmap).pixel_mode = '\a';
    iVar27 = uVar21 * 4;
    (dstSlot->bitmap).pitch = iVar27;
    (dstSlot->bitmap).num_grays = 0x100;
    uVar28 = (ulong)(iVar27 * uVar16);
    local_5c = ft_glyphslot_alloc_bitmap(dstSlot,uVar28);
    if (local_5c != 0) {
      return local_5c;
    }
    memset((dstSlot->bitmap).buffer,0,uVar28);
  }
  else {
    iVar27 = dstSlot->bitmap_left;
    iVar26 = dstSlot->bitmap_top;
    iVar24 = (dstSlot->bitmap).width + iVar27;
    iVar5 = srcSlot->bitmap_left;
    iVar6 = srcSlot->bitmap_top;
    iVar25 = iVar26 - (dstSlot->bitmap).rows;
    iVar29 = (srcSlot->bitmap).width + iVar5;
    iVar20 = iVar6 - (srcSlot->bitmap).rows;
    iVar12 = iVar20;
    if (iVar25 < iVar20) {
      iVar12 = iVar25;
    }
    iVar9 = iVar6;
    if (iVar6 < iVar26) {
      iVar9 = iVar26;
    }
    iVar10 = iVar5;
    if (iVar27 < iVar5) {
      iVar10 = iVar27;
    }
    iVar11 = iVar29;
    if (iVar29 < iVar24) {
      iVar11 = iVar24;
    }
    if ((iVar24 < iVar29 || iVar5 < iVar27) || (iVar26 < iVar6 || iVar20 < iVar25)) {
      uVar16 = iVar9 - iVar12;
      uVar21 = (iVar11 - iVar10) * 4;
      local_58 = (FT_Byte *)ft_mem_alloc((face->root).memory,(ulong)(uVar16 * uVar21),&local_5c);
      if (local_5c != 0) {
        return local_5c;
      }
      local_4c = uVar16;
      local_48 = face;
      local_40 = srcSlot;
      if ((dstSlot->bitmap).rows != 0) {
        __dest = local_58 +
                 ((long)dstSlot->bitmap_left - (long)iVar10) * 4 +
                 (long)(int)((iVar9 - dstSlot->bitmap_top) * uVar21);
        puVar18 = (dstSlot->bitmap).buffer;
        uVar16 = 0;
        do {
          memcpy(__dest,puVar18,(ulong)((dstSlot->bitmap).width << 2));
          puVar18 = puVar18 + (dstSlot->bitmap).pitch;
          __dest = __dest + uVar21;
          uVar16 = uVar16 + 1;
        } while (uVar16 < (dstSlot->bitmap).rows);
      }
      ft_glyphslot_set_bitmap(dstSlot,local_58);
      dstSlot->bitmap_top = iVar9;
      dstSlot->bitmap_left = iVar10;
      (dstSlot->bitmap).width = iVar11 - iVar10;
      (dstSlot->bitmap).rows = local_4c;
      (dstSlot->bitmap).pitch = uVar21;
      pFVar1 = &dstSlot->internal->flags;
      *pFVar1 = *pFVar1 | 1;
      dstSlot->format = FT_GLYPH_FORMAT_BITMAP;
      srcSlot = local_40;
      face = local_48;
    }
  }
  if (color_index == 0xffff) {
    if (face->have_foreground_color == '\0') {
      pFVar8 = (face->palette_data).palette_flags;
      if (pFVar8 != (FT_UShort *)0x0) {
        bVar19 = 0xff;
        bVar15 = 0xff;
        uVar21 = 0xff;
        bVar23 = 0xff;
        if ((pFVar8[face->palette_index] & 2) != 0) goto LAB_00247702;
      }
      bVar19 = 0xff;
      bVar15 = 0;
      uVar21 = 0;
      bVar23 = 0;
    }
    else {
      bVar23 = (face->foreground_color).blue;
      uVar21 = (uint)(face->foreground_color).green;
      bVar15 = (face->foreground_color).red;
      bVar19 = (face->foreground_color).alpha;
    }
  }
  else {
    pFVar7 = face->palette;
    bVar23 = pFVar7[color_index].blue;
    uVar21 = (uint)pFVar7[color_index].green;
    bVar15 = pFVar7[color_index].red;
    bVar19 = pFVar7[color_index].alpha;
  }
LAB_00247702:
  uVar16 = (srcSlot->bitmap).rows;
  if (uVar16 != 0) {
    iVar27 = (dstSlot->bitmap).pitch;
    puVar18 = (dstSlot->bitmap).buffer +
              ((long)srcSlot->bitmap_left - (long)dstSlot->bitmap_left) * 4 +
              (long)((dstSlot->bitmap_top - srcSlot->bitmap_top) * iVar27);
    puVar14 = (srcSlot->bitmap).buffer;
    uVar28 = (ulong)(srcSlot->bitmap).width;
    uVar22 = 0;
    do {
      iVar26 = (int)uVar28;
      uVar28 = 0;
      if (iVar26 != 0) {
        uVar16 = 3;
        uVar30 = 0;
        do {
          uVar17 = ((uint)puVar14[uVar30] * (uint)bVar19) / 0xff;
          iVar27 = 0xff - uVar17;
          bVar2 = puVar18[uVar16 - 2];
          bVar3 = puVar18[uVar16 - 1];
          bVar4 = puVar18[uVar16];
          puVar18[uVar16 - 3] =
               (char)((uint)puVar18[uVar16 - 3] * iVar27 * 0x8081 >> 0x17) +
               (char)((uVar17 * bVar23 & 0xffff) / 0xff);
          puVar18[uVar16 - 2] =
               (char)((uint)bVar2 * iVar27 * 0x8081 >> 0x17) +
               (char)((uVar17 * uVar21 & 0xffff) / 0xff);
          puVar18[uVar16 - 1] =
               (char)((uint)bVar3 * iVar27 * 0x8081 >> 0x17) +
               (char)((uVar17 * bVar15 & 0xffff) / 0xff);
          puVar18[uVar16] = (char)((uint)bVar4 * iVar27 * 0x8081 >> 0x17) + (char)uVar17;
          uVar30 = uVar30 + 1;
          uVar28 = (ulong)(srcSlot->bitmap).width;
          uVar16 = uVar16 + 4;
        } while (uVar30 < uVar28);
        iVar27 = (dstSlot->bitmap).pitch;
        uVar16 = (srcSlot->bitmap).rows;
      }
      puVar14 = puVar14 + (srcSlot->bitmap).pitch;
      puVar18 = puVar18 + iVar27;
      uVar22 = uVar22 + 1;
    } while (uVar22 < uVar16);
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_colr_blend_layer( TT_Face       face,
                            FT_UInt       color_index,
                            FT_GlyphSlot  dstSlot,
                            FT_GlyphSlot  srcSlot )
  {
    FT_Error  error;

    FT_UInt  x, y;
    FT_Byte  b, g, r, alpha;

    FT_ULong  size;
    FT_Byte*  src;
    FT_Byte*  dst;


    if ( !dstSlot->bitmap.buffer )
    {
      /* Initialize destination of color bitmap */
      /* with the size of first component.      */
      dstSlot->bitmap_left = srcSlot->bitmap_left;
      dstSlot->bitmap_top  = srcSlot->bitmap_top;

      dstSlot->bitmap.width      = srcSlot->bitmap.width;
      dstSlot->bitmap.rows       = srcSlot->bitmap.rows;
      dstSlot->bitmap.pixel_mode = FT_PIXEL_MODE_BGRA;
      dstSlot->bitmap.pitch      = (int)dstSlot->bitmap.width * 4;
      dstSlot->bitmap.num_grays  = 256;

      size = dstSlot->bitmap.rows * (unsigned int)dstSlot->bitmap.pitch;

      error = ft_glyphslot_alloc_bitmap( dstSlot, size );
      if ( error )
        return error;

      FT_MEM_ZERO( dstSlot->bitmap.buffer, size );
    }
    else
    {
      /* Resize destination if needed such that new component fits. */
      FT_Int  x_min, x_max, y_min, y_max;


      x_min = FT_MIN( dstSlot->bitmap_left, srcSlot->bitmap_left );
      x_max = FT_MAX( dstSlot->bitmap_left + (FT_Int)dstSlot->bitmap.width,
                      srcSlot->bitmap_left + (FT_Int)srcSlot->bitmap.width );

      y_min = FT_MIN( dstSlot->bitmap_top - (FT_Int)dstSlot->bitmap.rows,
                      srcSlot->bitmap_top - (FT_Int)srcSlot->bitmap.rows );
      y_max = FT_MAX( dstSlot->bitmap_top, srcSlot->bitmap_top );

      if ( x_min != dstSlot->bitmap_left                                 ||
           x_max != dstSlot->bitmap_left + (FT_Int)dstSlot->bitmap.width ||
           y_min != dstSlot->bitmap_top - (FT_Int)dstSlot->bitmap.rows   ||
           y_max != dstSlot->bitmap_top                                  )
      {
        FT_Memory  memory = face->root.memory;

        FT_UInt  width = (FT_UInt)( x_max - x_min );
        FT_UInt  rows  = (FT_UInt)( y_max - y_min );
        FT_UInt  pitch = width * 4;

        FT_Byte*  buf = NULL;
        FT_Byte*  p;
        FT_Byte*  q;


        size  = rows * pitch;
        if ( FT_ALLOC( buf, size ) )
          return error;

        p = dstSlot->bitmap.buffer;
        q = buf +
            (int)pitch * ( y_max - dstSlot->bitmap_top ) +
            4 * ( dstSlot->bitmap_left - x_min );

        for ( y = 0; y < dstSlot->bitmap.rows; y++ )
        {
          FT_MEM_COPY( q, p, dstSlot->bitmap.width * 4 );

          p += dstSlot->bitmap.pitch;
          q += pitch;
        }

        ft_glyphslot_set_bitmap( dstSlot, buf );

        dstSlot->bitmap_top  = y_max;
        dstSlot->bitmap_left = x_min;

        dstSlot->bitmap.width = width;
        dstSlot->bitmap.rows  = rows;
        dstSlot->bitmap.pitch = (int)pitch;

        dstSlot->internal->flags |= FT_GLYPH_OWN_BITMAP;
        dstSlot->format           = FT_GLYPH_FORMAT_BITMAP;
      }
    }

    if ( color_index == 0xFFFF )
    {
      if ( face->have_foreground_color )
      {
        b     = face->foreground_color.blue;
        g     = face->foreground_color.green;
        r     = face->foreground_color.red;
        alpha = face->foreground_color.alpha;
      }
      else
      {
        if ( face->palette_data.palette_flags                          &&
             ( face->palette_data.palette_flags[face->palette_index] &
                 FT_PALETTE_FOR_DARK_BACKGROUND                      ) )
        {
          /* white opaque */
          b     = 0xFF;
          g     = 0xFF;
          r     = 0xFF;
          alpha = 0xFF;
        }
        else
        {
          /* black opaque */
          b     = 0x00;
          g     = 0x00;
          r     = 0x00;
          alpha = 0xFF;
        }
      }
    }
    else
    {
      b     = face->palette[color_index].blue;
      g     = face->palette[color_index].green;
      r     = face->palette[color_index].red;
      alpha = face->palette[color_index].alpha;
    }

    /* XXX Convert if srcSlot.bitmap is not grey? */
    src = srcSlot->bitmap.buffer;
    dst = dstSlot->bitmap.buffer +
          dstSlot->bitmap.pitch * ( dstSlot->bitmap_top - srcSlot->bitmap_top ) +
          4 * ( srcSlot->bitmap_left - dstSlot->bitmap_left );

    for ( y = 0; y < srcSlot->bitmap.rows; y++ )
    {
      for ( x = 0; x < srcSlot->bitmap.width; x++ )
      {
        int  aa = src[x];
        int  fa = alpha * aa / 255;

        int  fb = b * fa / 255;
        int  fg = g * fa / 255;
        int  fr = r * fa / 255;

        int  ba2 = 255 - fa;

        int  bb = dst[4 * x + 0];
        int  bg = dst[4 * x + 1];
        int  br = dst[4 * x + 2];
        int  ba = dst[4 * x + 3];


        dst[4 * x + 0] = (FT_Byte)( bb * ba2 / 255 + fb );
        dst[4 * x + 1] = (FT_Byte)( bg * ba2 / 255 + fg );
        dst[4 * x + 2] = (FT_Byte)( br * ba2 / 255 + fr );
        dst[4 * x + 3] = (FT_Byte)( ba * ba2 / 255 + fa );
      }

      src += srcSlot->bitmap.pitch;
      dst += dstSlot->bitmap.pitch;
    }

    return FT_Err_Ok;
  }